

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::ScaleLayerParams::InternalSwap
          (ScaleLayerParams *this,ScaleLayerParams *other)

{
  RepeatedField<unsigned_long> *pRVar1;
  RepeatedField<unsigned_long> *pRVar2;
  bool bVar3;
  intptr_t iVar4;
  void *pvVar5;
  void *pvVar6;
  WeightParams *pWVar7;
  WeightParams *pWVar8;
  WeightParams *pWVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  LogMessage *pLVar13;
  LogFinisher local_61;
  LogMessage local_60;
  
  iVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
  (this->super_MessageLite)._internal_metadata_.ptr_ =
       (other->super_MessageLite)._internal_metadata_.ptr_;
  (other->super_MessageLite)._internal_metadata_.ptr_ = iVar4;
  pRVar1 = &this->shapescale_;
  pRVar2 = &other->shapescale_;
  if (this == other) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x324);
    pLVar13 = google::protobuf::internal::LogMessage::operator<<
                        (&local_60,"CHECK failed: this != other: ");
    google::protobuf::internal::LogFinisher::operator=(&local_61,pLVar13);
    google::protobuf::internal::LogMessage::~LogMessage(&local_60);
    iVar11 = pRVar1->current_size_;
    iVar12 = pRVar1->total_size_;
    pvVar5 = (this->shapescale_).arena_or_elements_;
    iVar10 = pRVar2->total_size_;
    pvVar6 = (other->shapescale_).arena_or_elements_;
    pRVar1->current_size_ = pRVar2->current_size_;
    pRVar1->total_size_ = iVar10;
    (this->shapescale_).arena_or_elements_ = pvVar6;
    pRVar2->current_size_ = iVar11;
    pRVar2->total_size_ = iVar12;
    (other->shapescale_).arena_or_elements_ = pvVar5;
    google::protobuf::internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x324);
    pLVar13 = google::protobuf::internal::LogMessage::operator<<
                        (&local_60,"CHECK failed: this != other: ");
    google::protobuf::internal::LogFinisher::operator=(&local_61,pLVar13);
    google::protobuf::internal::LogMessage::~LogMessage(&local_60);
  }
  else {
    iVar11 = pRVar1->current_size_;
    iVar12 = pRVar1->total_size_;
    pvVar5 = (this->shapescale_).arena_or_elements_;
    iVar10 = pRVar2->total_size_;
    pvVar6 = (other->shapescale_).arena_or_elements_;
    pRVar1->current_size_ = pRVar2->current_size_;
    pRVar1->total_size_ = iVar10;
    (this->shapescale_).arena_or_elements_ = pvVar6;
    pRVar2->current_size_ = iVar11;
    pRVar2->total_size_ = iVar12;
    (other->shapescale_).arena_or_elements_ = pvVar5;
  }
  iVar11 = (this->shapebias_).current_size_;
  iVar12 = (this->shapebias_).total_size_;
  pvVar5 = (this->shapebias_).arena_or_elements_;
  iVar10 = (other->shapebias_).total_size_;
  pvVar6 = (other->shapebias_).arena_or_elements_;
  (this->shapebias_).current_size_ = (other->shapebias_).current_size_;
  (this->shapebias_).total_size_ = iVar10;
  (this->shapebias_).arena_or_elements_ = pvVar6;
  (other->shapebias_).current_size_ = iVar11;
  (other->shapebias_).total_size_ = iVar12;
  (other->shapebias_).arena_or_elements_ = pvVar5;
  pWVar7 = this->scale_;
  pWVar8 = this->bias_;
  pWVar9 = other->bias_;
  this->scale_ = other->scale_;
  this->bias_ = pWVar9;
  other->scale_ = pWVar7;
  other->bias_ = pWVar8;
  bVar3 = this->hasbias_;
  this->hasbias_ = other->hasbias_;
  other->hasbias_ = bVar3;
  return;
}

Assistant:

void ScaleLayerParams::InternalSwap(ScaleLayerParams* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  shapescale_.InternalSwap(&other->shapescale_);
  shapebias_.InternalSwap(&other->shapebias_);
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(ScaleLayerParams, hasbias_)
      + sizeof(ScaleLayerParams::hasbias_)
      - PROTOBUF_FIELD_OFFSET(ScaleLayerParams, scale_)>(
          reinterpret_cast<char*>(&scale_),
          reinterpret_cast<char*>(&other->scale_));
}